

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O0

uint lyjson_parse_boolean(ly_ctx *ctx,char *data)

{
  int iVar1;
  uint local_24;
  uint len;
  char *data_local;
  ly_ctx *ctx_local;
  
  local_24 = 0;
  iVar1 = strncmp(data,"false",5);
  if (iVar1 == 0) {
    local_24 = 5;
  }
  else {
    iVar1 = strncmp(data,"true",4);
    if (iVar1 == 0) {
      local_24 = 4;
    }
  }
  if ((((data[local_24] == '\0') || (data[local_24] == ',')) || (data[local_24] == ']')) ||
     ((data[local_24] == '}' || (iVar1 = lyjson_isspace((int)data[local_24]), iVar1 != 0)))) {
    ctx_local._4_4_ = local_24;
  }
  else {
    ly_vlog(ctx,LYE_XML_INVAL,LY_VLOG_NONE,(void *)0x0,"JSON literal value (expected true or false)"
           );
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static unsigned int
lyjson_parse_boolean(struct ly_ctx *ctx, const char *data)
{
    unsigned int len = 0;

    if (!strncmp(data, "false", 5)) {
        len = 5;
    } else if (!strncmp(data, "true", 4)) {
        len = 4;
    }

    if (data[len] && data[len] != ',' && data[len] != ']' && data[len] != '}' && !lyjson_isspace(data[len])) {
        LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_NONE, NULL, "JSON literal value (expected true or false)");
        return 0;
    }

    return len;
}